

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O0

void __thiscall
http_request_method_parsing_simple04_Test::TestBody(http_request_method_parsing_simple04_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_a0;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  Message local_58 [3];
  http_request_method local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  undefined1 auStack_20 [4];
  http_request_method method;
  sub_string str;
  http_request_method_parsing_simple04_Test *this_local;
  
  str.end_ = (char *)this;
  _auStack_20 = sub_string::literal<4ul>((char (*) [4])0x187106);
  gtest_ar.message_.ptr_._4_4_ = parse_request_method((sub_string *)auStack_20);
  local_3c = PUT;
  testing::internal::EqHelper<false>::Compare<http_request_method,http_request_method>
            ((EqHelper<false> *)local_38,"method","http_request_method::PUT",
             (http_request_method *)((long)&gtest_ar.message_.ptr_ + 4),&local_3c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  bVar1 = sub_string::empty((sub_string *)auStack_20);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_70,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)local_70,(AssertionResult *)0x1870b9,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

TEST(http_request_method_parsing, simple04)
{
    sub_string str = sub_string::literal("PUT");
    http_request_method method = parse_request_method(str);
    EXPECT_EQ(method, http_request_method::PUT);
    EXPECT_TRUE(str.empty());
}